

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

BinaryExpr<const_(anonymous_namespace)::ns::Project<std::multiset<(anonymous_namespace)::ns::Value,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>_>_&,_const_(anonymous_namespace)::ns::Project<std::multiset<(anonymous_namespace)::ns::Value,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>_>_&>
* __thiscall
Catch::
ExprLhs<(anonymous_namespace)::ns::Project<std::multiset<(anonymous_namespace)::ns::Value,std::less<(anonymous_namespace)::ns::Value>,std::allocator<(anonymous_namespace)::ns::Value>>>const&>
::operator==(BinaryExpr<const_(anonymous_namespace)::ns::Project<std::multiset<(anonymous_namespace)::ns::Value,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>_>_&,_const_(anonymous_namespace)::ns::Project<std::multiset<(anonymous_namespace)::ns::Value,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>_>_&>
             *__return_storage_ptr__,
            ExprLhs<(anonymous_namespace)::ns::Project<std::multiset<(anonymous_namespace)::ns::Value,std::less<(anonymous_namespace)::ns::Value>,std::allocator<(anonymous_namespace)::ns::Value>>>const&>
            *this,Project<std::multiset<(anonymous_namespace)::ns::Value,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>_>
                  *rhs)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  StringRef local_38;
  
  if ((*(int *)this == rhs->version) &&
     (sVar1 = *(size_t *)(this + 0x10), sVar1 == (rhs->name)._M_string_length)) {
    if (sVar1 != 0) {
      iVar3 = bcmp(*(void **)(this + 8),(rhs->name)._M_dataplus._M_p,sVar1);
      if (iVar3 != 0) goto LAB_0073d7b5;
    }
    sVar1 = *(size_t *)(this + 0x30);
    if (sVar1 == (rhs->author)._M_string_length) {
      if (sVar1 != 0) {
        iVar3 = bcmp(*(void **)(this + 0x28),(rhs->author)._M_dataplus._M_p,sVar1);
        if (iVar3 != 0) goto LAB_0073d7b5;
      }
      sVar1 = *(size_t *)(this + 0x50);
      if (sVar1 == (rhs->notes)._M_string_length) {
        if (sVar1 != 0) {
          iVar3 = bcmp(*(void **)(this + 0x48),(rhs->notes)._M_dataplus._M_p,sVar1);
          if (iVar3 != 0) goto LAB_0073d7b5;
        }
        if (this[0x68] ==
            (ExprLhs<(anonymous_namespace)::ns::Project<std::multiset<(anonymous_namespace)::ns::Value,std::less<(anonymous_namespace)::ns::Value>,std::allocator<(anonymous_namespace)::ns::Value>>>const&>
             )rhs->showNotes) {
          bVar2 = std::operator==((_Rb_tree<(anonymous_namespace)::ns::Value,_(anonymous_namespace)::ns::Value,_std::_Identity<(anonymous_namespace)::ns::Value>,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>
                                   *)(this + 0x70),
                                  (_Rb_tree<(anonymous_namespace)::ns::Value,_(anonymous_namespace)::ns::Value,_std::_Identity<(anonymous_namespace)::ns::Value>,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>
                                   *)(rhs->values)._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_left);
          goto LAB_0073d7b7;
        }
      }
    }
  }
LAB_0073d7b5:
  bVar2 = false;
LAB_0073d7b7:
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_00b4ad58;
  __return_storage_ptr__->m_lhs =
       (Project<std::multiset<(anonymous_namespace)::ns::Value,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>_>
        *)this;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return (BinaryExpr<const_(anonymous_namespace)::ns::Project<std::multiset<(anonymous_namespace)::ns::Value,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>_>_&,_const_(anonymous_namespace)::ns::Project<std::multiset<(anonymous_namespace)::ns::Value,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>_>_&>
          *)&PTR_streamReconstructedExpression_00b4ad58;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }